

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptree.c
# Opt level: O0

void p_tree_foreach(PTree *tree,PTraverseFunc traverse_func,ppointer user_data)

{
  bool bVar1;
  int local_38;
  int local_34;
  pboolean need_stop;
  pint mod_counter;
  PTreeBaseNode *prev_node;
  PTreeBaseNode *cur_node;
  ppointer user_data_local;
  PTraverseFunc traverse_func_local;
  PTree *tree_local;
  
  if ((tree != (PTree *)0x0 && traverse_func != (PTraverseFunc)0x0) &&
     (tree->root != (PTreeBaseNode *)0x0)) {
    prev_node = tree->root;
    local_34 = 0;
    local_38 = 0;
    do {
      while( true ) {
        while( true ) {
          if (prev_node == (PTreeBaseNode *)0x0) {
            return;
          }
          if (prev_node->left != (PTreeBaseNode_ *)0x0) break;
          if (local_38 == 0) {
            local_38 = (*traverse_func)(prev_node->key,prev_node->value,user_data);
          }
          prev_node = prev_node->right;
        }
        _need_stop = prev_node->left;
        while( true ) {
          bVar1 = false;
          if (_need_stop->right != (PTreeBaseNode_ *)0x0) {
            bVar1 = _need_stop->right != prev_node;
          }
          if (!bVar1) break;
          _need_stop = _need_stop->right;
        }
        if (_need_stop->right != (PTreeBaseNode_ *)0x0) break;
        _need_stop->right = prev_node;
        prev_node = prev_node->left;
        local_34 = local_34 + 1;
      }
      if (local_38 == 0) {
        local_38 = (*traverse_func)(prev_node->key,prev_node->value,user_data);
      }
      prev_node = prev_node->right;
      _need_stop->right = (PTreeBaseNode_ *)0x0;
      local_34 = local_34 + -1;
    } while ((local_38 != 1) || (local_34 != 0));
  }
  return;
}

Assistant:

P_LIB_API void
p_tree_foreach (PTree		*tree,
		PTraverseFunc	traverse_func,
		ppointer	user_data)
{
	PTreeBaseNode	*cur_node;
	PTreeBaseNode	*prev_node;
	pint		mod_counter;
	pboolean	need_stop;

	if (P_UNLIKELY (tree == NULL || traverse_func == NULL))
		return;

	if (P_UNLIKELY (tree->root == NULL))
		return;

	cur_node    = tree->root;
	mod_counter = 0;
	need_stop   = FALSE;

	while (cur_node != NULL) {
		if (cur_node->left == NULL) {
			if (need_stop == FALSE)
				need_stop = traverse_func (cur_node->key,
							   cur_node->value,
							   user_data);

			cur_node = cur_node->right;
		} else {
			prev_node = cur_node->left;

			while (prev_node->right != NULL && prev_node->right != cur_node)
				prev_node = prev_node->right;

			if (prev_node->right == NULL) {
				prev_node->right = cur_node;
				cur_node         = cur_node->left;

				++mod_counter;
			} else {
				if (need_stop == FALSE)
					need_stop = traverse_func (cur_node->key,
								   cur_node->value,
								   user_data);

				cur_node         = cur_node->right;
				prev_node->right = NULL;

				--mod_counter;

				if (need_stop == TRUE && mod_counter == 0)
					return;
			}
		}
	}
}